

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O1

shared_ptr<const_rcg::Image> __thiscall rcg::ImageList::find(ImageList *this,uint64_t timestamp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  size_t *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  shared_ptr<const_rcg::Image> sVar9;
  
  psVar3 = *(size_t **)(timestamp + 8);
  lVar5 = *(long *)(timestamp + 0x10) - (long)psVar3;
  bVar8 = lVar5 != 0;
  if (bVar8) {
    uVar6 = lVar5 >> 4;
    sVar7 = *psVar3;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar7 + 8) != in_RDX._M_pi) {
      uVar4 = 0;
      do {
        if ((uVar6 + (uVar6 == 0)) - 1 == uVar4) goto LAB_0012d29a;
        sVar7 = psVar3[2];
        psVar3 = psVar3 + 2;
        uVar4 = uVar4 + 1;
      } while (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar7 + 8) != in_RDX._M_pi);
      bVar8 = uVar4 < uVar6;
    }
    this->maxsize = sVar7;
    psVar2 = (pointer)psVar3[1];
    (this->list).
    super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar2;
    if (psVar2 != (pointer)0x0) {
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(psVar2->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(psVar2->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    if (bVar8) goto LAB_0012d2a0;
  }
LAB_0012d29a:
  this->maxsize = 0;
  (this->list).
  super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0012d2a0:
  sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_rcg::Image>)
         sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp) const
{
  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getTimestampNS() == timestamp)
    {
      return list[i];
    }
  }

  return std::shared_ptr<const Image>();
}